

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b7745::TransformSelectorFor::~TransformSelectorFor(TransformSelectorFor *this)

{
  TransformSelectorFor *this_local;
  
  ~TransformSelectorFor(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TransformSelectorFor(index_type start, index_type stop, index_type step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }